

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastpackwithoutmask4_16(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  
  uVar1 = *in;
  *out = uVar1;
  uVar1 = in[1] << 4 | uVar1;
  *out = uVar1;
  uVar1 = in[2] << 8 | uVar1;
  *out = uVar1;
  uVar1 = in[3] << 0xc | uVar1;
  *out = uVar1;
  uVar1 = in[4] << 0x10 | uVar1;
  *out = uVar1;
  uVar1 = in[5] << 0x14 | uVar1;
  *out = uVar1;
  uVar1 = in[6] << 0x18 | uVar1;
  *out = uVar1;
  *out = in[7] << 0x1c | uVar1;
  uVar1 = in[8];
  out[1] = uVar1;
  uVar1 = in[9] << 4 | uVar1;
  out[1] = uVar1;
  uVar1 = in[10] << 8 | uVar1;
  out[1] = uVar1;
  uVar1 = in[0xb] << 0xc | uVar1;
  out[1] = uVar1;
  uVar1 = in[0xc] << 0x10 | uVar1;
  out[1] = uVar1;
  uVar1 = in[0xd] << 0x14 | uVar1;
  out[1] = uVar1;
  uVar1 = in[0xe] << 0x18 | uVar1;
  out[1] = uVar1;
  out[1] = in[0xf] << 0x1c | uVar1;
  return out + 2;
}

Assistant:

uint32_t *__fastpackwithoutmask4_16(const uint32_t *__restrict__ in,
                                    uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 20;
  ++in;
  *out |= ((*in)) << 24;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 20;
  ++in;
  *out |= ((*in)) << 24;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  ++in;

  return out;
}